

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O1

void __thiscall Pda::addNode(Pda *this,Node *n,bool start,bool end)

{
  pointer *pppNVar1;
  iterator iVar2;
  Node *local_20;
  
  iVar2._M_current =
       (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = n;
  if (iVar2._M_current ==
      (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&this->allNodes,iVar2,&local_20);
  }
  else {
    *iVar2._M_current = n;
    pppNVar1 = &(this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  if (start) {
    this->start = local_20;
  }
  if (end) {
    iVar2._M_current =
         (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
                ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&this->endNodes,iVar2,&local_20)
      ;
    }
    else {
      *iVar2._M_current = local_20;
      pppNVar1 = &(this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return;
}

Assistant:

void Pda::addNode(Tjen::Node *n, bool start, bool end) {
    this->allNodes.push_back(n);

    if(start){
        this->start = n;
    }
    if(end){
        this->endNodes.push_back(n);
    }
}